

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_GetMethodProperty<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,Var varInstance,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  bool bVar1;
  PropertyId propertyId;
  RecyclableObject *obj;
  InlineCache *pIVar2;
  undefined1 local_80 [8];
  PropertyValueInfo info;
  Var aValue;
  
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(varInstance);
  propertyId = GetPropertyIdFromCacheId(this,playout->inlineCacheIndex);
  bVar1 = VarIs<Js::RecyclableObject>(varInstance);
  if ((bVar1) &&
     (obj = UnsafeVarTo<Js::RecyclableObject>(varInstance), obj != (RecyclableObject *)0x0)) {
    bVar1 = VarIsImpl<Js::ScriptFunction>(obj);
    if (bVar1) {
      local_80 = (undefined1  [8])UnsafeVarTo<Js::ScriptFunction,Js::RecyclableObject>(obj);
    }
    else {
      local_80 = (undefined1  [8])0x0;
    }
    if ((local_80 != (undefined1  [8])0x0 && (propertyId == 0x5a || propertyId == 0x4e)) &&
       (((((ScriptFunction *)local_80)->super_ScriptFunctionBase).super_JavascriptFunction.
         super_DynamicObject.super_RecyclableObject.type.ptr)->entryPoint ==
        JavascriptFunction::DeferredParsingThunk)) {
      JavascriptFunction::DeferredParse((ScriptFunction **)local_80);
    }
    pIVar2 = GetInlineCache(this,playout->inlineCacheIndex);
    local_80 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_80,*(FunctionBody **)(this + 0x88),pIVar2,
               playout->inlineCacheIndex,true);
    bVar1 = CacheOperators::TryGetProperty<true,true,false,false,false,false,true,false,false,false>
                      (obj,false,obj,propertyId,(Var *)&info.inlineCacheIndex,
                       *(ScriptContext **)(this + 0x78),(PropertyCacheOperationInfo *)0x0,
                       (PropertyValueInfo *)local_80);
    if (bVar1) {
      SetReg<unsigned_int>(this,playout->Value,(Var)info._56_8_);
      return;
    }
  }
  else {
    pIVar2 = GetInlineCache(this,playout->inlineCacheIndex);
    local_80 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_80,*(FunctionBody **)(this + 0x88),pIVar2,
               playout->inlineCacheIndex,true);
  }
  OP_GetMethodProperty_NoFastPath<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
            (this,varInstance,playout);
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetMethodProperty(Var varInstance, unaligned T *playout)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(varInstance);
#endif
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        RecyclableObject* obj = JavascriptOperators::TryFromVar<RecyclableObject>(varInstance);
        if (obj)
        {
            ScriptFunction *fn = JavascriptOperators::TryFromVar<ScriptFunction>(obj);
            if ((propertyId == PropertyIds::apply || propertyId == PropertyIds::call) && fn)
            {
                // If the property being loaded is "apply"/"call", make an optimistic assumption that apply/call is not overridden and
                // undefer the function right here if it was defer parsed before. This is required so that the load of "apply"/"call"
                // happens from the same "type". Otherwise, we will have a polymorphic cache for load of "apply"/"call".
                if (fn->GetType()->GetEntryPoint() == JavascriptFunction::DeferredParsingThunk)
                {
                    JavascriptFunction::DeferredParse(&fn);
                }
            }
        }

        InlineCache *inlineCache = this->GetInlineCache(playout->inlineCacheIndex);

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->inlineCacheIndex, true);
        Var aValue;
        if (obj &&
            CacheOperators::TryGetProperty<true, true, false, false, false, false, true, false, false, false>(
                obj, false, obj, propertyId, &aValue, GetScriptContext(), nullptr, &info))
        {
            SetReg(playout->Value, aValue);
            return;
        }

        OP_GetMethodProperty_NoFastPath(varInstance, playout);
    }